

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong mkvparser::Segment::CreateInstance(IMkvReader *pReader,longlong pos,Segment **pSegment)

{
  int iVar1;
  long lVar2;
  longlong lVar3;
  long lVar4;
  ulong uVar5;
  Segment *this;
  ulong uVar6;
  ulong size;
  longlong lVar7;
  longlong total;
  long len;
  longlong available;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  lVar7 = -1;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_48,&local_38);
    if (iVar1 < 0) {
      lVar7 = (longlong)iVar1;
    }
    else {
      lVar7 = -1;
      if (local_38 <= local_48 && -1 < (long)local_38) {
        while( true ) {
          if ((-1 < (long)local_48) && ((long)local_48 <= pos)) {
            return -2;
          }
          lVar7 = GetUIntLength(pReader,pos,&local_40);
          if (lVar7 != 0) {
            return lVar7;
          }
          lVar2 = local_40 + pos;
          if ((-1 < (long)local_48) && ((long)local_48 < lVar2)) {
            return -2;
          }
          if ((long)local_38 < lVar2) {
            return lVar2;
          }
          lVar7 = ReadID(pReader,pos,&local_40);
          if (lVar7 < 0) {
            return -2;
          }
          lVar2 = local_40 + pos;
          lVar3 = GetUIntLength(pReader,lVar2,&local_40);
          if (lVar3 != 0) {
            return lVar3;
          }
          lVar4 = local_40 + lVar2;
          if ((-1 < (long)local_48) && ((long)local_48 < lVar4)) break;
          if ((long)local_38 < lVar4) {
            return lVar4;
          }
          uVar5 = ReadUInt(pReader,lVar2,&local_40);
          if ((long)uVar5 < 0) {
            return uVar5;
          }
          lVar2 = lVar2 + local_40;
          uVar6 = -1L << ((char)local_40 * '\a' & 0x3fU) ^ uVar5;
          if (lVar7 == 0x18538067) {
            size = 0xffffffffffffffff;
            if (((uVar6 != 0xffffffffffffffff) && (-1 < (long)local_48)) &&
               ((long)(uVar5 + lVar2) <= (long)local_48)) {
              size = uVar5;
            }
            this = (Segment *)operator_new(200,(nothrow_t *)&std::nothrow);
            if (this != (Segment *)0x0) {
              Segment(this,pReader,pos,lVar2,size);
            }
            *pSegment = this;
            return -(ulong)(this == (Segment *)0x0);
          }
          if (uVar6 == 0xffffffffffffffff) {
            return -2;
          }
          pos = lVar2 + uVar5;
          if ((-1 < (long)local_48) && ((long)local_48 < pos)) {
            return -2;
          }
          if ((long)local_38 < pos) {
            return pos;
          }
        }
        return -2;
      }
    }
  }
  return lVar7;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}